

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Builder<prometheus::Summary> * prometheus::BuildSummary(void)

{
  Builder<prometheus::Summary> *in_RDI;
  
  memset(in_RDI,0,0x70);
  detail::Builder<prometheus::Summary>::Builder(in_RDI);
  return in_RDI;
}

Assistant:

detail::Builder<Summary> BuildSummary() { return {}; }